

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O3

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::VirtualChannel::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,VirtualChannel *this,VCDU *vcdu)

{
  unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *this_00;
  raw *prVar1;
  TransportPDU *__ptr;
  byte *pbVar2;
  int iVar3;
  ostream *poVar4;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> this_01;
  ssize_t sVar5;
  uint uVar6;
  size_t __nbytes;
  VirtualChannel *pVVar7;
  pointer __p;
  VirtualChannel *pVVar8;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> _Var9;
  VirtualChannel *pVVar10;
  ulong uVar11;
  TransportPDU *local_58;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_50;
  _Head_base<0UL,_assembler::TransportPDU_*,_false> local_48;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *local_40;
  TransportPDU *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = __return_storage_ptr__;
  if (-1 < this->n_) {
    prVar1 = vcdu->data_;
    iVar3 = diffWithWrap<16777216u>
                      (this->n_,(uint)prVar1->_M_elems[4] |
                                (uint)prVar1->_M_elems[3] << 8 | (uint)prVar1->_M_elems[2] << 0x10);
    if (1 < iVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": VCDU drop! (lost ",0x13);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3 + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; prev: ",8);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->n_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; packet: ",10);
      prVar1 = vcdu->data_;
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar4,
                          (uint)prVar1->_M_elems[4] |
                          (uint)prVar1->_M_elems[3] << 8 | (uint)prVar1->_M_elems[2] << 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      __ptr = (this->tpdu_)._M_t.
              super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
              ._M_t.
              super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
              .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      if (__ptr != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&this->tpdu_,__ptr);
      }
    }
  }
  prVar1 = vcdu->data_;
  this->n_ = (uint)prVar1->_M_elems[4] |
             (uint)prVar1->_M_elems[3] << 8 | (uint)prVar1->_M_elems[2] << 0x10;
  uVar11 = (ulong)((prVar1->_M_elems[6] & 7) << 8);
  pVVar10 = (VirtualChannel *)(prVar1->_M_elems[7] | uVar11);
  iVar3 = (int)prVar1 + 8;
  this_00 = &this->tpdu_;
  _Var9._M_head_impl =
       (this->tpdu_)._M_t.
       super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
       ._M_t.
       super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
       .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  uVar11 = prVar1->_M_elems[7] | uVar11;
  pVVar7 = this;
  if (_Var9._M_head_impl == (TransportPDU *)0x0) goto joined_r0x001245c8;
  pbVar2 = *(byte **)&((_Var9._M_head_impl)->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  __nbytes = (long)*(pointer *)
                    ((long)&((_Var9._M_head_impl)->header).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) -
             (long)pbVar2;
  if (__nbytes == 6) {
    pVVar7 = (VirtualChannel *)0x374;
    if (((uint)uVar11 == 0x7ff) ||
       (pVVar8 = (VirtualChannel *)
                 (((long)((_Var9._M_head_impl)->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start -
                  (long)*(pointer *)
                         ((long)&((_Var9._M_head_impl)->data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                         8)) + (ulong)((uint)pbVar2[4] * 0x100 + (uint)pbVar2[5] + 1 & 0xffff)),
       pVVar7 = pVVar10, pVVar8 <= pVVar10)) {
      sVar5 = TransportPDU::read(_Var9._M_head_impl,iVar3,(void *)0x374,(size_t)pVVar7);
      _Var9._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      pVVar10 = *(VirtualChannel **)&(_Var9._M_head_impl)->header;
      if (((long)*(pointer *)((long)&(_Var9._M_head_impl)->header + 8) - (long)pVVar10 == 6) &&
         (pVVar10 = (VirtualChannel *)
                    (ulong)((uint)*(byte *)((long)&pVVar10->n_ + 1) +
                            (uint)(byte)pVVar10->n_ * 0x100 + 1 & 0xffff),
         (VirtualChannel *)
         (*(pointer *)((long)&(_Var9._M_head_impl)->data + 8) +
         -*(ulong *)&((_Var9._M_head_impl)->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>) == pVVar10))
      {
        (this->tpdu_)._M_t.
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        local_48._M_head_impl = _Var9._M_head_impl;
        process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)&local_48,local_40);
        if (local_48._M_head_impl != (TransportPDU *)0x0) {
          std::default_delete<assembler::TransportPDU>::operator()
                    ((default_delete<assembler::TransportPDU> *)&local_48,local_48._M_head_impl);
        }
        local_48._M_head_impl = (TransportPDU *)0x0;
      }
    }
    else {
      if ((((short)pVVar10 == 0) && (pVVar8 == (VirtualChannel *)0x6)) &&
         (uVar6 = (*pbVar2 & 7) << 8, pVVar10 = (VirtualChannel *)(ulong)uVar6,
         (pbVar2[1] | uVar6) == 0x7ff)) {
        (this_00->_M_t).
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
LAB_001247af:
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)this_00,_Var9._M_head_impl);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"VC ",3);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->id_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,": M_SDU continuation failed; ",0x1d);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," byte(s) needed to complete M_SDU, ",0x23);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," byte(s) available",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        _Var9._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        if (_Var9._M_head_impl != (TransportPDU *)0x0) goto LAB_001247af;
      }
      sVar5 = 0;
    }
  }
  else {
    sVar5 = TransportPDU::read(_Var9._M_head_impl,iVar3,(void *)0x374,__nbytes);
    _Var9._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
         ._M_t.
         super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
         .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
    pVVar10 = *(VirtualChannel **)&(_Var9._M_head_impl)->header;
    if (((long)*(pointer *)((long)&(_Var9._M_head_impl)->header + 8) - (long)pVVar10 == 6) &&
       (pVVar10 = (VirtualChannel *)
                  (ulong)((uint)*(byte *)((long)&pVVar10->n_ + 1) + (uint)(byte)pVVar10->n_ * 0x100
                          + 1 & 0xffff),
       (VirtualChannel *)
       (*(pointer *)((long)&(_Var9._M_head_impl)->data + 8) +
       -*(ulong *)&((_Var9._M_head_impl)->data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>) == pVVar10)) {
      (this->tpdu_)._M_t.
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
      local_50._M_head_impl = _Var9._M_head_impl;
      process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                    *)&local_50,local_40);
      if (local_50._M_head_impl != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (TransportPDU *)0x0;
    }
  }
  pVVar7 = pVVar10;
  if (sVar5 == 0x374) {
    return local_40;
  }
joined_r0x001245c8:
  if ((uint)uVar11 < 0x374) {
    do {
      this_01._M_head_impl = (TransportPDU *)operator_new(0x30);
      TransportPDU::TransportPDU(this_01._M_head_impl);
      local_38 = (TransportPDU *)0x0;
      _Var9._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>.
      _M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = this_01._M_head_impl;
      if ((_Var9._M_head_impl != (TransportPDU *)0x0) &&
         (std::default_delete<assembler::TransportPDU>::operator()
                    ((default_delete<assembler::TransportPDU> *)this_00,_Var9._M_head_impl),
         local_38 != (TransportPDU *)0x0)) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&local_38,local_38);
      }
      sVar5 = TransportPDU::read((this_00->_M_t).
                                 super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                 .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                 _M_head_impl,iVar3 + (int)uVar11,(void *)(0x374 - uVar11),
                                 (size_t)pVVar7);
      _Var9._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      pVVar7 = *(VirtualChannel **)&(_Var9._M_head_impl)->header;
      if (((long)*(pointer *)((long)&(_Var9._M_head_impl)->header + 8) - (long)pVVar7 == 6) &&
         (pVVar7 = (VirtualChannel *)
                   (ulong)((uint)*(byte *)((long)&pVVar7->n_ + 1) + (uint)(byte)pVVar7->n_ * 0x100 +
                           1 & 0xffff),
         (VirtualChannel *)
         (*(pointer *)((long)&(_Var9._M_head_impl)->data + 8) +
         -*(ulong *)&((_Var9._M_head_impl)->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>) == pVVar7))
      {
        (this->tpdu_)._M_t.
        super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
        ._M_t.
        super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
        .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl = (TransportPDU *)0x0;
        local_58 = _Var9._M_head_impl;
        process(this,(unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      *)&local_58,local_40);
        if (local_58 != (TransportPDU *)0x0) {
          std::default_delete<assembler::TransportPDU>::operator()
                    ((default_delete<assembler::TransportPDU> *)&local_58,local_58);
        }
        local_58 = (TransportPDU *)0x0;
      }
      uVar11 = uVar11 + sVar5;
    } while (uVar11 < 0x374);
  }
  return local_40;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> VirtualChannel::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;
  uint16_t firstHeader;
  size_t pos;

  // Sanity check on VCDU counter (wraps at 2^24)
  if (n_ >= 0) {
    auto skip = diffWithWrap<(1 << 24)>(n_, vcdu.getCounter());

    // Abort processing of pending TP_PDU in case of drop.
    if (skip > 1) {
      std::cerr
        <<  "VC " << id_
        << ": VCDU drop! (lost " << (skip - 1)
        << "; prev: " << n_
        << "; packet: " << vcdu.getCounter()
        << ")"
        << std::endl;
      tpdu_.reset();
    }
  }

  // Update counter with current VCDU
  n_ = vcdu.getCounter();

  // Get iterators to begin/end of the VCDU Data Unit
  auto data = vcdu.data();
  auto len = vcdu.len();

  // Extract "first header pointer" field from M_PDU header
  firstHeader = ((data[0] & 0x7) << 8) | data[1];

  // Skip over M_PDU header
  data += 2;
  len -= 2;

  // Resume extracting a packet if we still have a pointer
  pos = 0;
  if (tpdu_) {
    // Double check that the number of bytes left to read correspond
    // with the first header pointer. The latter takes precedence.
    if (tpdu_->headerComplete()) {
      auto bytesNeeded = tpdu_->length() - tpdu_->data.size();
      // If the first header pointer is 2047, there is no additional
      // header in the VCDU and we can read the entire thing.
      auto bytesAvailable = (firstHeader == 2047) ? len : firstHeader;
      if (firstHeader != 2047 && bytesAvailable < bytesNeeded) {
        // Don't log error message for fill packets.
        // On the GOES-16 HRIT feed these can expect 6 more bytes
        // if they are aligned on the VCDU boundary. I suspect this
        // number comes from the the 6 header bytes in a VCDU and
        // that this is a mistake in the HRIT feed assembly code.
        if (!(bytesAvailable == 0 && bytesNeeded == 6 && tpdu_->apid() == 2047)) {
          std::cerr
            <<  "VC " << id_
            << ": M_SDU continuation failed; "
            << bytesNeeded << " byte(s) needed to complete M_SDU, "
            << bytesAvailable << " byte(s) available"
            << std::endl;
        }
        tpdu_.reset();
      } else {
        pos += tpdu_->read(&data[pos], len - pos);
        if (tpdu_->dataComplete()) {
          process(std::move(tpdu_), out);
        }
      }
    } else {
      pos += tpdu_->read(&data[pos], len - pos);
      if (tpdu_->dataComplete()) {
        process(std::move(tpdu_), out);
      }
    }

    // Return early if we consumed all bytes
    if (pos == len) {
      return out;
    }
  }

  // Must have pointer to first header to continue
  if (firstHeader == 2047) {
    return out;
  }

  // Extract TP_PDUs until there is no more data
  pos = firstHeader;
  while (pos < len) {
    tpdu_ = std::unique_ptr<TransportPDU>(new TransportPDU);
    pos += tpdu_->read(&data[pos], len - pos);
    if (tpdu_->dataComplete()) {
      process(std::move(tpdu_), out);
    }
  }

  return out;
}